

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

SuspendedRequest * __thiscall
kj::_::NullableValue<kj::HttpServer::SuspendedRequest>::emplace<kj::HttpServer::SuspendedRequest>
          (NullableValue<kj::HttpServer::SuspendedRequest> *this,SuspendedRequest *params)

{
  uint uVar1;
  uchar *puVar2;
  size_t sVar3;
  ArrayDisposer *pAVar4;
  
  if (this->isSet == true) {
    this->isSet = false;
    HttpHeaders::~HttpHeaders(&(this->field_1).value.headers);
    if ((this->field_1).value.method.tag - 1 < 2) {
      (this->field_1).value.method.tag = 0;
    }
    puVar2 = (this->field_1).value.buffer.ptr;
    if (puVar2 != (uchar *)0x0) {
      sVar3 = (this->field_1).value.buffer.size_;
      (this->field_1).value.buffer.ptr = (uchar *)0x0;
      (this->field_1).value.buffer.size_ = 0;
      pAVar4 = (this->field_1).value.buffer.disposer;
      (**pAVar4->_vptr_ArrayDisposer)(pAVar4,puVar2,1,sVar3,sVar3,0);
    }
  }
  (this->field_1).value.buffer.ptr = (params->buffer).ptr;
  (this->field_1).value.buffer.size_ = (params->buffer).size_;
  (this->field_1).value.buffer.disposer = (params->buffer).disposer;
  (params->buffer).ptr = (uchar *)0x0;
  (params->buffer).size_ = 0;
  sVar3 = (params->leftover).size_;
  (this->field_1).value.leftover.ptr = (params->leftover).ptr;
  (this->field_1).value.leftover.size_ = sVar3;
  uVar1 = (params->method).tag;
  (this->field_1).value.method.tag = uVar1;
  if (uVar1 == 1) {
    *(undefined4 *)&(this->field_1).value.method.field_1 = *(undefined4 *)&(params->method).field_1;
  }
  sVar3 = (params->url).content.size_;
  (this->field_1).value.url.content.ptr = (params->url).content.ptr;
  (this->field_1).value.url.content.size_ = sVar3;
  HttpHeaders::HttpHeaders(&(this->field_1).value.headers,&params->headers);
  this->isSet = true;
  return (SuspendedRequest *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }